

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockReturnValueTest_hasReturnValue_TestShell::createTest
          (TEST_MockReturnValueTest_hasReturnValue_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                                  ,0x28);
  TEST_MockReturnValueTest_hasReturnValue_Test::TEST_MockReturnValueTest_hasReturnValue_Test
            ((TEST_MockReturnValueTest_hasReturnValue_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockReturnValueTest, hasReturnValue)
{
    CHECK(!mock().hasReturnValue());
    mock().expectOneCall("foo");
    CHECK(!mock().actualCall("foo").hasReturnValue());
    CHECK(!mock().hasReturnValue());

    mock().expectOneCall("foo2").andReturnValue(1);
    CHECK(mock().actualCall("foo2").hasReturnValue());
    CHECK(mock().hasReturnValue());
}